

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O2

SPIRCombinedImageSampler * __thiscall
spirv_cross::ObjectPool<spirv_cross::SPIRCombinedImageSampler>::
allocate<spirv_cross::SPIRCombinedImageSampler&>
          (ObjectPool<spirv_cross::SPIRCombinedImageSampler> *this,SPIRCombinedImageSampler *p)

{
  Vector<spirv_cross::SPIRCombinedImageSampler_*> *this_00;
  SPIRCombinedImageSampler *pSVar1;
  size_t sVar2;
  ulong count;
  bool bVar3;
  SPIRCombinedImageSampler *ptr;
  SPIRCombinedImageSampler *local_40;
  SPIRCombinedImageSampler *local_38;
  
  this_00 = &this->vacants;
  sVar2 = (this->vacants).super_VectorView<spirv_cross::SPIRCombinedImageSampler_*>.buffer_size;
  if (sVar2 == 0) {
    count = (ulong)(this->start_object_count <<
                   ((byte)(this->memory).
                          super_VectorView<std::unique_ptr<spirv_cross::SPIRCombinedImageSampler,_spirv_cross::ObjectPool<spirv_cross::SPIRCombinedImageSampler>::MallocDeleter>_>
                          .buffer_size & 0x1f));
    pSVar1 = (SPIRCombinedImageSampler *)malloc(count * 0x18);
    if (pSVar1 == (SPIRCombinedImageSampler *)0x0) {
      return (SPIRCombinedImageSampler *)0x0;
    }
    local_38 = pSVar1;
    SmallVector<spirv_cross::SPIRCombinedImageSampler_*,_0UL>::reserve(this_00,count);
    while (bVar3 = count != 0, count = count - 1, bVar3) {
      local_40 = pSVar1;
      SmallVector<spirv_cross::SPIRCombinedImageSampler_*,_0UL>::push_back(this_00,&local_40);
      pSVar1 = pSVar1 + 1;
    }
    SmallVector<std::unique_ptr<spirv_cross::SPIRCombinedImageSampler,spirv_cross::ObjectPool<spirv_cross::SPIRCombinedImageSampler>::MallocDeleter>,8ul>
    ::emplace_back<spirv_cross::SPIRCombinedImageSampler*&>
              ((SmallVector<std::unique_ptr<spirv_cross::SPIRCombinedImageSampler,spirv_cross::ObjectPool<spirv_cross::SPIRCombinedImageSampler>::MallocDeleter>,8ul>
                *)&this->memory,&local_38);
    sVar2 = (this->vacants).super_VectorView<spirv_cross::SPIRCombinedImageSampler_*>.buffer_size;
  }
  pSVar1 = (this_00->super_VectorView<spirv_cross::SPIRCombinedImageSampler_*>).ptr[sVar2 - 1];
  SmallVector<spirv_cross::SPIRCombinedImageSampler_*,_0UL>::pop_back(this_00);
  (pSVar1->super_IVariant).self.id = (p->super_IVariant).self.id;
  (pSVar1->super_IVariant)._vptr_IVariant = (_func_int **)&PTR__IVariant_0039e058;
  *(undefined8 *)&(pSVar1->super_IVariant).field_0xc = *(undefined8 *)&(p->super_IVariant).field_0xc
  ;
  (pSVar1->sampler).id = (p->sampler).id;
  return pSVar1;
}

Assistant:

T *allocate(P &&... p)
	{
		if (vacants.empty())
		{
			unsigned num_objects = start_object_count << memory.size();
			T *ptr = static_cast<T *>(malloc(num_objects * sizeof(T)));
			if (!ptr)
				return nullptr;

			vacants.reserve(num_objects);
			for (unsigned i = 0; i < num_objects; i++)
				vacants.push_back(&ptr[i]);

			memory.emplace_back(ptr);
		}

		T *ptr = vacants.back();
		vacants.pop_back();
		new (ptr) T(std::forward<P>(p)...);
		return ptr;
	}